

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5DataWrite(Fts5Index *p,i64 iRowid,u8 *pData,int nData)

{
  Vdbe *p_00;
  sqlite3_mutex *psVar1;
  int iVar2;
  char *zSql;
  sqlite3_stmt *pStmt;
  
  if (p->rc == 0) {
    pStmt = p->pWriter;
    if (pStmt == (sqlite3_stmt *)0x0) {
      zSql = sqlite3_mprintf("REPLACE INTO \'%q\'.\'%q_data\'(id, block) VALUES(?,?)",
                             p->pConfig->zDb,p->pConfig->zName);
      fts5IndexPrepareStmt(p,&p->pWriter,zSql);
      if (p->rc != 0) {
        return;
      }
      pStmt = p->pWriter;
    }
    sqlite3_bind_int64(pStmt,1,iRowid);
    bindText(p->pWriter,2,pData,nData,(_func_void_void_ptr *)0x0,'\0');
    sqlite3_step(p->pWriter);
    iVar2 = sqlite3_reset(p->pWriter);
    p->rc = iVar2;
    p_00 = (Vdbe *)p->pWriter;
    iVar2 = vdbeUnbind(p_00,2);
    if ((iVar2 == 0) && (psVar1 = p_00->db->mutex, psVar1 != (sqlite3_mutex *)0x0)) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar1);
      return;
    }
  }
  return;
}

Assistant:

static void fts5DataWrite(Fts5Index *p, i64 iRowid, const u8 *pData, int nData){
  if( p->rc!=SQLITE_OK ) return;

  if( p->pWriter==0 ){
    Fts5Config *pConfig = p->pConfig;
    fts5IndexPrepareStmt(p, &p->pWriter, sqlite3_mprintf(
          "REPLACE INTO '%q'.'%q_data'(id, block) VALUES(?,?)", 
          pConfig->zDb, pConfig->zName
    ));
    if( p->rc ) return;
  }

  sqlite3_bind_int64(p->pWriter, 1, iRowid);
  sqlite3_bind_blob(p->pWriter, 2, pData, nData, SQLITE_STATIC);
  sqlite3_step(p->pWriter);
  p->rc = sqlite3_reset(p->pWriter);
  sqlite3_bind_null(p->pWriter, 2);
}